

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rm_filehandle.cc
# Opt level: O0

RC __thiscall
RM_FileHandle::GetNextOneBit(RM_FileHandle *this,char *bitmap,int size,int start,int *location)

{
  int offset;
  int chunk;
  int i;
  int *location_local;
  int start_local;
  int size_local;
  char *bitmap_local;
  RM_FileHandle *this_local;
  
  offset = start;
  while( true ) {
    if (size <= offset) {
      return 0x6d;
    }
    if (((int)bitmap[offset / 8] & 1 << ((byte)(offset % 8) & 0x1f)) != 0) break;
    offset = offset + 1;
  }
  *location = offset;
  return 0;
}

Assistant:

RC RM_FileHandle::GetNextOneBit(char *bitmap, int size, int start, int &location){
  for(int i = start; i < size; i++){
    int chunk = i /8;
    int offset = i - chunk*8;
    if (((bitmap[chunk] & (1 << offset)) != 0)){
      location = i;
      return (0);
    }
  }
  return RM_ENDOFPAGE;
}